

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_tri_qua_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  long local_530;
  REF_INT local_520;
  long local_518;
  long local_4f8;
  long local_4c8;
  REF_INT local_4b8;
  long local_4b0;
  long local_490;
  long local_460;
  REF_INT local_450;
  long local_448;
  long local_428;
  long local_3f8;
  REF_INT local_3e8;
  long local_3e0;
  long local_3c0;
  int local_39c;
  int local_370;
  int local_344;
  int local_318;
  long local_2e0;
  REF_INT local_2d0;
  long local_2c8;
  long local_2a8;
  long local_278;
  REF_INT local_268;
  long local_260;
  long local_240;
  long local_210;
  REF_INT local_200;
  long local_1f8;
  long local_1d8;
  int local_1b8;
  int local_18c;
  int local_160;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1f7
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->twod = 1;
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
    local_160 = 0 / ((ref_mpi->n + 4) / ref_mpi->n);
  }
  else {
    local_160 = -((5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  if (ref_mpi->id == local_160) {
LAB_00129079:
    uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x207,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_1d8 = -1;
    }
    else {
      local_1d8 = ref_node_00->global[nnodesg];
    }
    if (local_1d8 / (long)((ref_mpi->n + 4) / ref_mpi->n) <
        (long)(5 - ref_mpi->n * (4 / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_1f8 = -1;
      }
      else {
        local_1f8 = ref_node_00->global[nnodesg];
      }
      local_200 = (REF_INT)(local_1f8 / (long)((ref_mpi->n + 4) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_210 = -1;
      }
      else {
        local_210 = ref_node_00->global[nnodesg];
      }
      local_200 = (int)((local_210 -
                        (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                       (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_200;
    uVar2 = ref_node_add(ref_node_00,1,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x208,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.0;
    ref_node_00->real[cell * 0xf + 1] = 1.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_240 = -1;
    }
    else {
      local_240 = ref_node_00->global[cell];
    }
    if (local_240 / (long)((ref_mpi->n + 4) / ref_mpi->n) <
        (long)(5 - ref_mpi->n * (4 / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_260 = -1;
      }
      else {
        local_260 = ref_node_00->global[cell];
      }
      local_268 = (REF_INT)(local_260 / (long)((ref_mpi->n + 4) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_278 = -1;
      }
      else {
        local_278 = ref_node_00->global[cell];
      }
      local_268 = (int)((local_278 -
                        (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                       (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_268;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x209,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 1.0;
    ref_node_00->real[local[0] * 0xf + 1] = 0.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2a8 = -1;
    }
    else {
      local_2a8 = ref_node_00->global[local[0]];
    }
    if (local_2a8 / (long)((ref_mpi->n + 4) / ref_mpi->n) <
        (long)(5 - ref_mpi->n * (4 / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_2c8 = -1;
      }
      else {
        local_2c8 = ref_node_00->global[local[0]];
      }
      local_2d0 = (REF_INT)(local_2c8 / (long)((ref_mpi->n + 4) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_2e0 = -1;
      }
      else {
        local_2e0 = ref_node_00->global[local[0]];
      }
      local_2d0 = (int)((local_2e0 -
                        (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                       (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_2d0;
    uVar2 = ref_cell_add(pRVar1->cell[3],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x20b,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (1 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
      local_18c = 1 / ((ref_mpi->n + 4) / ref_mpi->n);
    }
    else {
      local_18c = (1 - (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                  (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    if (ref_mpi->id == local_18c) goto LAB_00129079;
    if (2 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
      local_1b8 = 2 / ((ref_mpi->n + 4) / ref_mpi->n);
    }
    else {
      local_1b8 = (2 - (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                  (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    if (ref_mpi->id == local_1b8) goto LAB_00129079;
  }
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
    local_318 = 0 / ((ref_mpi->n + 4) / ref_mpi->n);
  }
  else {
    local_318 = -((5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  if (ref_mpi->id != local_318) {
    if (4 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
      local_344 = 4 / ((ref_mpi->n + 4) / ref_mpi->n);
    }
    else {
      local_344 = (4 - (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                  (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
    }
    if (ref_mpi->id != local_344) {
      if (3 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
        local_370 = 3 / ((ref_mpi->n + 4) / ref_mpi->n);
      }
      else {
        local_370 = (3 - (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                    (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
      }
      if (ref_mpi->id != local_370) {
        if (1 / ((ref_mpi->n + 4) / ref_mpi->n) < 5 - ref_mpi->n * (4 / ref_mpi->n)) {
          local_39c = 1 / ((ref_mpi->n + 4) / ref_mpi->n);
        }
        else {
          local_39c = (1 - (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                      (4 / ref_mpi->n) + (5 - ref_mpi->n * (4 / ref_mpi->n));
        }
        if (ref_mpi->id != local_39c) goto LAB_0012b020;
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x21b
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_3c0 = -1;
  }
  else {
    local_3c0 = ref_node_00->global[nnodesg];
  }
  if (local_3c0 / (long)((ref_mpi->n + 4) / ref_mpi->n) < (long)(5 - ref_mpi->n * (4 / ref_mpi->n)))
  {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_3e0 = -1;
    }
    else {
      local_3e0 = ref_node_00->global[nnodesg];
    }
    local_3e8 = (REF_INT)(local_3e0 / (long)((ref_mpi->n + 4) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_3f8 = -1;
    }
    else {
      local_3f8 = ref_node_00->global[nnodesg];
    }
    local_3e8 = (int)((local_3f8 -
                      (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                     (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_3e8;
  uVar2 = ref_node_add(ref_node_00,4,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x21c
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = -1.0;
  ref_node_00->real[cell * 0xf + 1] = 0.0;
  ref_node_00->real[cell * 0xf + 2] = 0.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_428 = -1;
  }
  else {
    local_428 = ref_node_00->global[cell];
  }
  if (local_428 / (long)((ref_mpi->n + 4) / ref_mpi->n) < (long)(5 - ref_mpi->n * (4 / ref_mpi->n)))
  {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_448 = -1;
    }
    else {
      local_448 = ref_node_00->global[cell];
    }
    local_450 = (REF_INT)(local_448 / (long)((ref_mpi->n + 4) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_460 = -1;
    }
    else {
      local_460 = ref_node_00->global[cell];
    }
    local_450 = (int)((local_460 -
                      (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                     (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_450;
  uVar2 = ref_node_add(ref_node_00,3,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x21d
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = -1.0;
  ref_node_00->real[local[0] * 0xf + 1] = 1.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_490 = -1;
  }
  else {
    local_490 = ref_node_00->global[local[0]];
  }
  if (local_490 / (long)((ref_mpi->n + 4) / ref_mpi->n) < (long)(5 - ref_mpi->n * (4 / ref_mpi->n)))
  {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_4b0 = -1;
    }
    else {
      local_4b0 = ref_node_00->global[local[0]];
    }
    local_4b8 = (REF_INT)(local_4b0 / (long)((ref_mpi->n + 4) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_4c8 = -1;
    }
    else {
      local_4c8 = ref_node_00->global[local[0]];
    }
    local_4b8 = (int)((local_4c8 -
                      (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                     (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_4b8;
  uVar2 = ref_node_add(ref_node_00,1,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x21e
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[1] * 0xf] = 0.0;
  ref_node_00->real[local[1] * 0xf + 1] = 1.0;
  ref_node_00->real[local[1] * 0xf + 2] = 0.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_4f8 = -1;
  }
  else {
    local_4f8 = ref_node_00->global[local[1]];
  }
  if (local_4f8 / (long)((ref_mpi->n + 4) / ref_mpi->n) < (long)(5 - ref_mpi->n * (4 / ref_mpi->n)))
  {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_518 = -1;
    }
    else {
      local_518 = ref_node_00->global[local[1]];
    }
    local_520 = (REF_INT)(local_518 / (long)((ref_mpi->n + 4) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_530 = -1;
    }
    else {
      local_530 = ref_node_00->global[local[1]];
    }
    local_520 = (int)((local_530 -
                      (5 - ref_mpi->n * (4 / ref_mpi->n)) * ((ref_mpi->n + 4) / ref_mpi->n)) /
                     (long)(4 / ref_mpi->n)) + (5 - ref_mpi->n * (4 / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_520;
  uVar2 = ref_cell_add(pRVar1->cell[6],&nnodesg,&ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x220
           ,"ref_fixture_tri_qua_grid",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_0012b020:
  ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,5);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x223
           ,"ref_fixture_tri_qua_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_qua_grid(REF_GRID *ref_grid_ptr,
                                            REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 5;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 4;
  global[2] = 3;
  global[3] = 1;
  global[4] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, -1.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}